

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O0

SolutionCollection * InferExamAnswers::Algorithm::runAlgorithm(ExamResults *examResults)

{
  bool bVar1;
  pointer pvVar2;
  uint64_t count;
  long in_RSI;
  SolutionCollection *in_RDI;
  _BinBase<std::__minus,_std::valarray<unsigned_char>,_std::valarray<unsigned_char>_> _Var3;
  uint8_t in_stack_00000016;
  uint8_t in_stack_00000017;
  ExamResults *in_stack_00000018;
  uint64_t combinationCount;
  SolutionCollection *leftSolutions;
  const_iterator it;
  valarray<unsigned_char> leftScore;
  type *rightSolutions;
  type *rightScore;
  const_iterator __end1;
  const_iterator __begin1;
  ScoreMap *__range1;
  ScoreMap leftScores;
  ScoreMap rightScores;
  uint8_t splitIndex;
  SolutionCollection *solutions;
  unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
  *in_stack_fffffffffffffe98;
  valarray<unsigned_char> *in_stack_fffffffffffffea0;
  valarray<unsigned_char> *in_stack_fffffffffffffea8;
  valarray<unsigned_char> *in_stack_fffffffffffffeb0;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_unsigned_char,_unsigned_char>,_unsigned_char>
  *in_stack_fffffffffffffeb8;
  valarray<unsigned_char> *in_stack_fffffffffffffec0;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  local_f8;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  local_f0;
  _BinBase<std::__minus,_std::valarray<unsigned_char>,_std::valarray<unsigned_char>_> local_e8;
  type *local_c8;
  type *local_c0;
  reference local_b8;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  local_b0;
  _Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
  local_a8;
  undefined1 *local_a0;
  undefined1 local_95;
  undefined1 local_50 [63];
  byte local_11;
  
  local_11 = *(byte *)(in_RSI + 0x20) >> 1;
  computeScoreMap(in_stack_00000018,in_stack_00000017,in_stack_00000016);
  computeScoreMap(in_stack_00000018,in_stack_00000017,in_stack_00000016);
  local_95 = 0;
  SolutionCollection::SolutionCollection(in_RDI);
  local_a0 = local_50;
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
       ::end(in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
    if (!bVar1) break;
    local_b8 = std::__detail::
               _Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
                            *)0x1318c2);
    local_c0 = std::get<0ul,std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>
                         ((pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>
                           *)0x1318d7);
    local_c8 = std::get<1ul,std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>
                         ((pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>
                           *)0x1318ec);
    _Var3 = (_BinBase<std::__minus,_std::valarray<unsigned_char>,_std::valarray<unsigned_char>_>)
            std::operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_e8 = _Var3;
    std::valarray<unsigned_char>::
    valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,unsigned_char,unsigned_char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
         ::find(in_stack_fffffffffffffe98,(key_type *)0x13195f);
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
         ::end(in_stack_fffffffffffffe98);
    bVar1 = std::__detail::operator==(&local_f0,&local_f8);
    if (!bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
                             *)0x131a06);
      in_stack_fffffffffffffec0 =
           (valarray<unsigned_char> *)SolutionCollection::getSize(&pvVar2->second);
      in_stack_fffffffffffffeb8 =
           (_Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_unsigned_char,_unsigned_char>,_unsigned_char>
            *)SolutionCollection::getSize(local_c8);
      count = (long)in_stack_fffffffffffffec0 * (long)in_stack_fffffffffffffeb8;
      in_stack_fffffffffffffeb0 = (valarray<unsigned_char> *)SolutionCollection::getSize(in_RDI);
      if ((in_stack_fffffffffffffeb0 == (valarray<unsigned_char> *)0x0) && (count == 1)) {
        in_stack_fffffffffffffea8 =
             (valarray<unsigned_char> *)SolutionCollection::getSolution(&pvVar2->second);
        in_stack_fffffffffffffe98 =
             (unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
              *)((long)in_stack_fffffffffffffea8 << (local_11 & 0x3f));
        in_stack_fffffffffffffea0 =
             (valarray<unsigned_char> *)SolutionCollection::getSolution(local_c8);
        SolutionCollection::addSolution
                  (in_RDI,(ulong)in_stack_fffffffffffffe98 | (ulong)in_stack_fffffffffffffea0);
      }
      else {
        SolutionCollection::grow(in_RDI,count);
      }
    }
    std::valarray<unsigned_char>::~valarray(in_stack_fffffffffffffea0);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>
                  *)in_stack_fffffffffffffea0);
  }
  local_95 = 1;
  std::
  unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
  ::~unordered_map((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                    *)0x131b36);
  std::
  unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
  ::~unordered_map((unordered_map<std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection,_InferExamAnswers::ScoreValarrayHash,_InferExamAnswers::ScoreValarrayEqual,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>_>
                    *)0x131b43);
  return in_RDI;
}

Assistant:

SolutionCollection Algorithm::runAlgorithm(const ExamResults& examResults)
{
	/**
	 * We split the answers of all students into two parts. We brute force
	 * The possible exam solution for each side and then combine the results
	 */
	const uint8_t splitIndex = examResults.questionCount / 2;

	/**
	 * The results of the brute force computation of each side is stored
	 * in a map. The key is a valarray of the score of each student and the
	 * value are the associated solution(s). This way we can easily compute
	 * what the corresponding key is to a score in a map because we can
	 * subtract the key from the obtained scores to obtain the required key
	 * for the other half.
	 */
	const auto rightScores = computeScoreMap(examResults, 0, splitIndex);
	const auto leftScores = computeScoreMap(examResults, splitIndex, examResults.questionCount);

	SolutionCollection solutions;

	// Combine the left and right scores
	for (const auto& [rightScore, rightSolutions] : rightScores) {
		const std::valarray<uint8_t> leftScore = examResults.scores - rightScore;

		const auto it = leftScores.find(leftScore);
		if (it == leftScores.end()) {
			continue;
		}

		const auto& leftSolutions = it->second;

		/**
		 * we only actually add the solutions here if the cardinality of the cartesian
		 * product is 1 since if it is larger we aren't interested in the actual solution
		 * just the number of them so we can just add dummy solutions
		 */
		auto combinationCount = leftSolutions.getSize() * rightSolutions.getSize();
		if (solutions.getSize() == 0 && combinationCount == 1) {
			solutions.addSolution((leftSolutions.getSolution() << splitIndex) | rightSolutions.getSolution());
		} else {
			solutions.grow(combinationCount);
		}
	}

	return solutions;
}